

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
mpt::reference<mpt::layout::line>::reference
          (reference<mpt::layout::line> *this,reference<mpt::layout::line> *ref)

{
  reference<mpt::layout::line> *ref_local;
  reference<mpt::layout::line> *this_local;
  
  this->_ref = (line *)0x0;
  operator=(this,ref);
  return;
}

Assistant:

inline reference(const reference &ref) : _ref(0)
	{
		*this = ref;
	}